

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.h
# Opt level: O2

bool __thiscall
rapidjson::
GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>
::Key(GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>
      *this,Ch *str,SizeType len,bool copy)

{
  bool bVar1;
  SchemaType *this_00;
  SchemaValidationContext<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>
  *context;
  bool bVar2;
  SizeType i_;
  ulong uVar3;
  char *pcVar4;
  
  if (this->valid_ != true) {
    return false;
  }
  AppendToken(this,str,len);
  this_00 = CurrentSchema(this);
  context = internal::Stack<rapidjson::CrtAllocator>::
            Top<rapidjson::internal::SchemaValidationContext<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>,rapidjson::CrtAllocator>>>
                      (&this->schemaStack_);
  bVar1 = internal::
          Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>
          ::Key(this_00,context,str,len,copy);
  if (!bVar1) {
    bVar2 = false;
    bVar1 = false;
    if ((this->flags_ & 1) == 0) goto LAB_0014c2da;
  }
  for (pcVar4 = (this->schemaStack_).stack_; pcVar4 != (this->schemaStack_).stackTop_;
      pcVar4 = pcVar4 + 0x90) {
    if (*(Hasher<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> **)(pcVar4 + 0x38) !=
        (Hasher<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)0x0) {
      internal::Hasher<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::WriteBuffer
                (*(Hasher<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> **)(pcVar4 + 0x38),
                 kStringType,str,(ulong)len);
    }
    if (*(long *)(pcVar4 + 0x48) != 0) {
      for (uVar3 = 0; uVar3 < *(uint *)(pcVar4 + 0x50); uVar3 = uVar3 + 1) {
        Key((GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>
             *)(*(long *)(*(long *)(pcVar4 + 0x48) + uVar3 * 8) + -8),str,len,copy);
      }
    }
    if (*(long *)(pcVar4 + 0x58) != 0) {
      for (uVar3 = 0; uVar3 < *(uint *)(pcVar4 + 0x60); uVar3 = uVar3 + 1) {
        Key((GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>
             *)(*(long *)(*(long *)(pcVar4 + 0x58) + uVar3 * 8) + -8),str,len,copy);
      }
    }
  }
  bVar2 = true;
  bVar1 = true;
LAB_0014c2da:
  this->valid_ = bVar2;
  return bVar1;
}

Assistant:

bool Key(const Ch* str, SizeType len, bool copy) {
        RAPIDJSON_SCHEMA_PRINT(Method, "GenericSchemaValidator::Key", str);
        if (!valid_) return false;
        AppendToken(str, len);
        if (!CurrentSchema().Key(CurrentContext(), str, len, copy) && !GetContinueOnErrors()) {
            valid_ = false;
            return valid_;
        }
        RAPIDJSON_SCHEMA_HANDLE_PARALLEL_(Key, (str, len, copy));
        valid_ = !outputHandler_ || outputHandler_->Key(str, len, copy);
        return valid_;
    }